

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void push_symbol(Context_conflict *ctx,SymbolMap *map,char *sym,MOJOSHADER_astDataType *dt,int index
                ,int check_dupes)

{
  int iVar1;
  bool bVar2;
  void *local_40;
  void *value;
  SymbolScope *item;
  int check_dupes_local;
  int index_local;
  MOJOSHADER_astDataType *dt_local;
  char *sym_local;
  SymbolMap *map_local;
  Context_conflict *ctx_local;
  
  if (ctx->out_of_memory == 0) {
    value = (void *)0x0;
    local_40 = (void *)0x0;
    item._0_4_ = check_dupes;
    item._4_4_ = index;
    _check_dupes_local = dt;
    dt_local = (MOJOSHADER_astDataType *)sym;
    sym_local = (char *)map;
    map_local = (SymbolMap *)ctx;
    if (((check_dupes == 0) || (sym == (char *)0x0)) ||
       (iVar1 = hash_find(map->hash,sym,&local_40), iVar1 == 0)) {
LAB_0013ee2d:
      value = Malloc((Context_conflict *)map_local,0x20);
      if (value != (void *)0x0) {
        if ((dt_local == (MOJOSHADER_astDataType *)0x0) ||
           (iVar1 = hash_insert(*(HashTable **)sym_local,dt_local,value), iVar1 != -1)) {
          *(MOJOSHADER_astDataType **)value = dt_local;
          *(int *)((long)value + 0x10) = item._4_4_;
          *(MOJOSHADER_astDataType **)((long)value + 8) = _check_dupes_local;
          *(undefined4 *)((long)value + 0x14) = 0;
          *(undefined8 *)((long)value + 0x18) = *(undefined8 *)(sym_local + 8);
          *(void **)(sym_local + 8) = value;
        }
        else {
          Free((Context_conflict *)map_local,value);
        }
      }
    }
    else {
      value = *(void **)(sym_local + 8);
      while( true ) {
        bVar2 = false;
        if (value != (void *)0x0) {
          bVar2 = *value != 0;
        }
        if (!bVar2) goto LAB_0013ee2d;
        if (value == local_40) break;
        value = *(void **)((long)value + 0x18);
      }
      failf((Context_conflict *)map_local,"Symbol \'%s\' already defined",dt_local);
    }
  }
  return;
}

Assistant:

static void push_symbol(Context *ctx, SymbolMap *map, const char *sym,
                        const MOJOSHADER_astDataType *dt, const int index,
                        const int check_dupes)
{
    if (ctx->out_of_memory)
        return;

    // Decide if this symbol is defined, and if it's in the current scope.
    SymbolScope *item = NULL;
    const void *value = NULL;
    if ((check_dupes) && (sym != NULL) && (hash_find(map->hash, sym, &value)))
    {
        // check the current scope for a dupe.
        // !!! FIXME: note current scope's starting index, see if found
        // !!! FIXME:  item is < index (and thus, a previous scope).
        item = map->scope;
        while ((item) && (item->symbol))
        {
            if ( ((const void *) item) == value )
            {
                failf(ctx, "Symbol '%s' already defined", sym);
                return;
            } // if
            item = item->next;
        } // while
    } // if

    // Add the symbol to our map and scope stack.
    item = (SymbolScope *) Malloc(ctx, sizeof (SymbolScope));
    if (item == NULL)
        return;

    if (sym != NULL)  // sym can be NULL if we're pushing a new scope.
    {
        if (hash_insert(map->hash, sym, item) == -1)
        {
            Free(ctx, item);
            return;
        } // if
    } // if

    item->symbol = sym;  // cached strings, don't copy.
    item->index = index;
    item->datatype = dt;
    item->referenced = 0;
    item->next = map->scope;
    map->scope = item;
}